

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

void __thiscall
myvk::CommandBuffer::CmdCopy
          (CommandBuffer *this,Ptr<BufferBase> *src,Ptr<BufferBase> *dst,
          vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *regions)

{
  VkCommandBuffer pVVar1;
  PFN_vkCmdCopyBuffer p_Var2;
  element_type *peVar3;
  VkBuffer pVVar4;
  VkBuffer pVVar5;
  size_type sVar6;
  VkBufferCopy *pVVar7;
  vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *in_RCX;
  long in_RDI;
  
  p_Var2 = vkCmdCopyBuffer;
  pVVar1 = *(VkCommandBuffer *)(in_RDI + 0x28);
  peVar3 = std::__shared_ptr_access<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2acabe);
  pVVar4 = BufferBase::GetHandle(peVar3);
  peVar3 = std::__shared_ptr_access<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2acad5);
  pVVar5 = BufferBase::GetHandle(peVar3);
  sVar6 = std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::size(in_RCX);
  pVVar7 = std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::data
                     ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)0x2acafa);
  (*p_Var2)(pVVar1,pVVar4,pVVar5,(uint32_t)sVar6,pVVar7);
  return;
}

Assistant:

void CommandBuffer::CmdCopy(const Ptr<BufferBase> &src, const Ptr<BufferBase> &dst,
                            const std::vector<VkBufferCopy> &regions) const {
	vkCmdCopyBuffer(m_command_buffer, src->GetHandle(), dst->GetHandle(), regions.size(), regions.data());
}